

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflex.h
# Opt level: O3

void __thiscall ClassInfo::~ClassInfo(ClassInfo *this)

{
  pointer pcVar1;
  
  this->_vptr_ClassInfo = (_func_int **)&PTR__ClassInfo_00104d58;
  pcVar1 = (this->m_className)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_className).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~ClassInfo(){}